

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void BatchNorm(pBox *pbox,BN *beta,BN *mean,BN *var)

{
  mydataFmt *pmVar1;
  mydataFmt *pmVar2;
  mydataFmt *pmVar3;
  int iVar4;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  float *pfVar10;
  ulong uVar11;
  float fVar12;
  ulong uVar5;
  
  pfVar10 = pbox->pdata;
  if (pfVar10 == (float *)0x0) {
    pcVar9 = "Relu feature is NULL!!";
  }
  else {
    pmVar1 = var->pdata;
    pcVar9 = "the  BatchNorm bias is NULL!!";
    if (((pmVar1 != (mydataFmt *)0x0) && (pmVar2 = mean->pdata, pmVar2 != (mydataFmt *)0x0)) &&
       (pmVar3 = beta->pdata, pmVar3 != (mydataFmt *)0x0)) {
      uVar7 = pbox->height * pbox->width;
      uVar11 = 0;
      uVar8 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar8 = uVar11;
      }
      for (; (long)uVar11 < (long)pbox->channel; uVar11 = uVar11 + 1) {
        fVar12 = pmVar1[uVar11] + 0.001;
        if (fVar12 < 0.0) {
          fVar12 = sqrtf(fVar12);
        }
        else {
          fVar12 = SQRT(fVar12);
        }
        uVar5 = uVar8;
        while (iVar4 = (int)uVar5, uVar5 = (ulong)(iVar4 - 1), iVar4 != 0) {
          *pfVar10 = *pfVar10 * (1.0 / fVar12) + pmVar2[uVar11] * -(1.0 / fVar12) + pmVar3[uVar11];
          pfVar10 = pfVar10 + 1;
        }
      }
      return;
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void BatchNorm(struct pBox *pbox, struct BN *beta, struct BN *mean, struct BN *var) {
    if (pbox->pdata == NULL) {
        cout << "Relu feature is NULL!!" << endl;
        return;
    }
    if ((var->pdata == NULL) || (mean->pdata == NULL) || (beta->pdata == NULL)) {
        cout << "the  BatchNorm bias is NULL!!" << endl;
        return;
    }
    mydataFmt *pp = pbox->pdata;
    mydataFmt *vp = var->pdata;
    mydataFmt *mp = mean->pdata;
    mydataFmt *bp = beta->pdata;
    int gamma = 1;
    float epsilon = 0.001;
    long dis = pbox->width * pbox->height;
    mydataFmt temp = 0;
    for (int channel = 0; channel < pbox->channel; channel++) {
        temp = gamma / sqrt(((vp[channel]) + epsilon));
        for (int col = 0; col < dis; col++) {
            *pp = temp * (*pp) + ((bp[channel]) - temp * (mp[channel]));
            pp++;
        }
    }
}